

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3.cpp
# Opt level: O2

void __thiscall CTPNReplaced::gen_code(CTPNReplaced *this,int discard,int for_condition)

{
  int iVar1;
  int iVar2;
  CTcGenTarg *pCVar3;
  CTcSymFunc *this_00;
  
  this_00 = CTPNCodeBodyBase::get_replaced_func(&G_cs->code_body_->super_CTPNCodeBodyBase);
  if (this_00 == (CTcSymFunc *)0x0) {
    CTcTokenizer::log_error(0x2d22);
    CTcGenTarg::write_op(G_cg,'\v');
  }
  else {
    CTcGenTarg::write_op(G_cg,'\v');
    CTcSymFuncBase::add_abs_fixup(&this_00->super_CTcSymFuncBase,&G_cs->super_CTcDataStream);
  }
  CTcDataStream::write4(&G_cs->super_CTcDataStream,0);
  pCVar3 = G_cg;
  iVar2 = G_cg->sp_depth_;
  iVar1 = iVar2 + 1;
  G_cg->sp_depth_ = iVar1;
  if (pCVar3->max_sp_depth_ <= iVar2) {
    pCVar3->max_sp_depth_ = iVar1;
  }
  return;
}

Assistant:

void CTPNReplaced::gen_code(int discard, int for_condition)
{
    /* get the modified base function symbol */
    CTcSymFunc *mod_base = G_cs->get_code_body()->get_replaced_func();

    /* make sure we're in a 'modify func()' context */
    if (mod_base == 0)
        G_tok->log_error(TCERR_REPLACED_NOT_AVAIL);

    /* this expression yields a pointer to the modified base function */
    G_cg->write_op(OPC_PUSHFNPTR);

    /* add a fixup for the current code location */
    if (mod_base != 0)
        mod_base->add_abs_fixup(G_cs);

    /* write a placeholder offset - arbitrarily use zero */
    G_cs->write4(0);

    /* note the push */
    G_cg->note_push();
}